

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O2

int32 read_classdef_file(hash_table_t *classes,char *file_name)

{
  bool bVar1;
  int iVar2;
  int32 iVar3;
  FILE *__stream;
  char *pcVar4;
  glist_t g;
  glist_t g_00;
  classdef_t *classdef;
  char **ppcVar5;
  float32 *pfVar6;
  ulong uVar7;
  classdef_t *pcVar8;
  ulong uVar9;
  gnode_s *pgVar10;
  gnode_s *pgVar11;
  float32 val;
  double dVar12;
  char *local_268;
  int32 is_pipe;
  char *wptr [2];
  char line [512];
  
  __stream = (FILE *)fopen_comp(file_name,"r",&is_pipe);
  if (__stream == (FILE *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
            ,0x394,"File %s not found\n",file_name);
    return -1;
  }
LAB_00105b6c:
  g = (glist_t)0x0;
  g_00 = (glist_t)0x0;
  local_268 = (char *)0x0;
  bVar1 = false;
LAB_00105b7c:
  do {
    iVar2 = feof(__stream);
    if ((iVar2 != 0) || (pcVar4 = fgets(line,0x200,__stream), pcVar4 == (char *)0x0)) {
      iVar3 = 0;
      goto LAB_00105d73;
    }
    iVar3 = str2words(line,wptr,2);
  } while (iVar3 < 1);
  if (bVar1) {
    val = 1.0;
    if (iVar3 == 2) {
      iVar2 = strcmp(wptr[0],"END");
      if (iVar2 == 0) goto LAB_00105c74;
      dVar12 = atof_c(wptr[1]);
      val = (float32)(float)dVar12;
    }
    pcVar4 = __ckd_salloc__(wptr[0],
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                            ,0x3d9);
    g = glist_add_ptr(g,pcVar4);
    g_00 = glist_add_float32(g_00,val);
  }
  else {
    bVar1 = false;
    if ((iVar3 != 2) || (iVar2 = strcmp(wptr[0],"LMCLASS"), iVar2 != 0)) goto LAB_00105b7c;
    local_268 = __ckd_salloc__(wptr[1],
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                               ,0x3e3);
  }
  bVar1 = true;
  goto LAB_00105b7c;
LAB_00105c74:
  if ((local_268 == (char *)0x0) || (iVar2 = strcmp(wptr[1],local_268), iVar2 != 0))
  goto LAB_00105df1;
  classdef = (classdef_t *)
             __ckd_calloc__(1,0x18,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                            ,0x3b1);
  g = glist_reverse(g);
  g_00 = glist_reverse(g_00);
  iVar3 = glist_count(g);
  classdef->n_words = iVar3;
  ppcVar5 = (char **)__ckd_calloc__((long)iVar3,8,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                    ,0x3b6);
  classdef->words = ppcVar5;
  pfVar6 = (float32 *)
           __ckd_calloc__((long)classdef->n_words,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                          ,0x3b8);
  classdef->weights = pfVar6;
  uVar7 = (ulong)(uint)classdef->n_words;
  if (classdef->n_words < 1) {
    uVar7 = 0;
  }
  pgVar10 = g;
  pgVar11 = g_00;
  for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
    *(anytype_t *)(classdef->words + uVar9) = pgVar10->data;
    classdef->weights[uVar9] = (float32)(float)(pgVar11->data).fl;
    pgVar10 = pgVar10->next;
    pgVar11 = pgVar11->next;
  }
  pcVar8 = (classdef_t *)hash_table_enter(classes,local_268,classdef);
  if (pcVar8 != classdef) {
    classdef_free(classdef);
LAB_00105df1:
    iVar3 = -1;
LAB_00105d73:
    fclose_comp((FILE *)__stream,is_pipe);
    for (pgVar10 = g; pgVar10 != (glist_t)0x0; pgVar10 = pgVar10->next) {
      ckd_free((pgVar10->data).ptr);
    }
    glist_free(g);
    glist_free(g_00);
    ckd_free(local_268);
    return iVar3;
  }
  glist_free(g);
  glist_free(g_00);
  goto LAB_00105b6c;
}

Assistant:

int32
read_classdef_file(hash_table_t * classes, const char *file_name)
{
    FILE *fp;
    int32 is_pipe;
    int inclass;  /**< Are we currently reading a list of class words? */
    int32 rv = -1;
    gnode_t *gn;
    glist_t classwords = NULL;
    glist_t classprobs = NULL;
    char *classname = NULL;

    if ((fp = fopen_comp(file_name, "r", &is_pipe)) == NULL) {
        E_ERROR("File %s not found\n", file_name);
        return -1;
    }

    inclass = FALSE;
    while (!feof(fp)) {
        char line[512];
        char *wptr[2];
        int n_words;

        if (fgets(line, sizeof(line), fp) == NULL)
            break;

        n_words = str2words(line, wptr, 2);
        if (n_words <= 0)
            continue;

        if (inclass) {
            /* Look for an end of class marker. */
            if (n_words == 2 && 0 == strcmp(wptr[0], "END")) {
                classdef_t *classdef;
                gnode_t *word, *weight;
                int32 i;

                if (classname == NULL || 0 != strcmp(wptr[1], classname))
                    goto error_out;
                inclass = FALSE;

                /* Construct a class from the list of words collected. */
                classdef = ckd_calloc(1, sizeof(*classdef));
                classwords = glist_reverse(classwords);
                classprobs = glist_reverse(classprobs);
                classdef->n_words = glist_count(classwords);
                classdef->words = ckd_calloc(classdef->n_words,
                                             sizeof(*classdef->words));
                classdef->weights = ckd_calloc(classdef->n_words,
                                               sizeof(*classdef->weights));
                word = classwords;
                weight = classprobs;
                for (i = 0; i < classdef->n_words; ++i) {
                    classdef->words[i] = gnode_ptr(word);
                    classdef->weights[i] = gnode_float32(weight);
                    word = gnode_next(word);
                    weight = gnode_next(weight);
                }

                /* Add this class to the hash table. */
                if (hash_table_enter(classes, classname, classdef) !=
                    classdef) {
                    classdef_free(classdef);
                    goto error_out;
                }

                /* Reset everything. */
                glist_free(classwords);
                glist_free(classprobs);
                classwords = NULL;
                classprobs = NULL;
                classname = NULL;
            }
            else {
                float32 fprob;

                if (n_words == 2)
                    fprob = atof_c(wptr[1]);
                else
                    fprob = 1.0f;
                /* Add it to the list of words for this class. */
                classwords =
                    glist_add_ptr(classwords, ckd_salloc(wptr[0]));
                classprobs = glist_add_float32(classprobs, fprob);
            }
        }
        else {
            /* Start a new LM class if the LMCLASS marker is seen */
            if (n_words == 2 && 0 == strcmp(wptr[0], "LMCLASS")) {
                if (inclass)
                    goto error_out;
                inclass = TRUE;
                classname = ckd_salloc(wptr[1]);
            }
            /* Otherwise, just ignore whatever junk we got */
        }
    }
    rv = 0;                     /* Success. */

  error_out:
    /* Free all the stuff we might have allocated. */
    fclose_comp(fp, is_pipe);
    for (gn = classwords; gn; gn = gnode_next(gn))
        ckd_free(gnode_ptr(gn));
    glist_free(classwords);
    glist_free(classprobs);
    ckd_free(classname);

    return rv;
}